

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdCreateHandle_Test::~cfdcapi_common_CfdCreateHandle_Test
          (cfdcapi_common_CfdCreateHandle_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_common_CfdCreateHandle_Test((cfdcapi_common_CfdCreateHandle_Test *)0x33d1e8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdCreateHandle) {
  int ret = CfdCreateHandle(NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  void* handle = NULL;
  ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdFreeHandle(NULL);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}